

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_common.hpp
# Opt level: O0

string * __thiscall chaiscript::AST_Node::to_string(AST_Node *this,string *t_prepend)

{
  bool bVar1;
  ostream *poVar2;
  char *pcVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  ostream *poVar4;
  AST_Node *in_RDX;
  long in_RSI;
  string *in_RDI;
  shared_ptr<chaiscript::AST_Node> *elem;
  const_iterator __end2;
  const_iterator __begin2;
  vector<std::shared_ptr<chaiscript::AST_Node>,_std::allocator<std::shared_ptr<chaiscript::AST_Node>_>_>
  *__range2;
  ostringstream oss;
  element_type *in_stack_fffffffffffffd88;
  string local_200 [32];
  string local_1e0 [32];
  reference local_1c0;
  shared_ptr<chaiscript::AST_Node> *local_1b8;
  __normal_iterator<const_std::shared_ptr<chaiscript::AST_Node>_*,_std::vector<std::shared_ptr<chaiscript::AST_Node>,_std::allocator<std::shared_ptr<chaiscript::AST_Node>_>_>_>
  local_1b0;
  long local_1a8;
  ostringstream local_190 [244];
  int in_stack_ffffffffffffff64;
  string *in_stack_ffffffffffffffe0;
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  poVar2 = std::operator<<((ostream *)local_190,(string *)in_RDX);
  poVar2 = std::operator<<(poVar2,"(");
  pcVar3 = anon_unknown_407::ast_node_type_to_string(in_stack_ffffffffffffff64);
  poVar2 = std::operator<<(poVar2,pcVar3);
  __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          std::operator<<(poVar2,") ");
  poVar2 = std::operator<<((ostream *)__lhs,(string *)(in_RSI + 0x20));
  poVar4 = std::operator<<(poVar2," : ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,*(int *)(in_RSI + 0x40));
  poVar4 = std::operator<<(poVar4,", ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,*(int *)(in_RSI + 0x44));
  std::operator<<(poVar4,'\n');
  local_1a8 = in_RSI + 0x60;
  local_1b0._M_current =
       (shared_ptr<chaiscript::AST_Node> *)
       std::
       vector<std::shared_ptr<chaiscript::AST_Node>,_std::allocator<std::shared_ptr<chaiscript::AST_Node>_>_>
       ::begin((vector<std::shared_ptr<chaiscript::AST_Node>,_std::allocator<std::shared_ptr<chaiscript::AST_Node>_>_>
                *)in_stack_fffffffffffffd88);
  local_1b8 = (shared_ptr<chaiscript::AST_Node> *)
              std::
              vector<std::shared_ptr<chaiscript::AST_Node>,_std::allocator<std::shared_ptr<chaiscript::AST_Node>_>_>
              ::end((vector<std::shared_ptr<chaiscript::AST_Node>,_std::allocator<std::shared_ptr<chaiscript::AST_Node>_>_>
                     *)in_stack_fffffffffffffd88);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_std::shared_ptr<chaiscript::AST_Node>_*,_std::vector<std::shared_ptr<chaiscript::AST_Node>,_std::allocator<std::shared_ptr<chaiscript::AST_Node>_>_>_>
                        *)poVar4,
                       (__normal_iterator<const_std::shared_ptr<chaiscript::AST_Node>_*,_std::vector<std::shared_ptr<chaiscript::AST_Node>,_std::allocator<std::shared_ptr<chaiscript::AST_Node>_>_>_>
                        *)in_stack_fffffffffffffd88);
    if (!bVar1) break;
    local_1c0 = __gnu_cxx::
                __normal_iterator<const_std::shared_ptr<chaiscript::AST_Node>_*,_std::vector<std::shared_ptr<chaiscript::AST_Node>,_std::allocator<std::shared_ptr<chaiscript::AST_Node>_>_>_>
                ::operator*(&local_1b0);
    in_stack_fffffffffffffd88 =
         std::__shared_ptr_access<chaiscript::AST_Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
         operator->((__shared_ptr_access<chaiscript::AST_Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     *)0x3638a6);
    std::operator+(__lhs,(char *)poVar2);
    to_string(in_RDX,in_stack_ffffffffffffffe0);
    std::operator<<((ostream *)local_190,local_1e0);
    std::__cxx11::string::~string(local_1e0);
    std::__cxx11::string::~string(local_200);
    __gnu_cxx::
    __normal_iterator<const_std::shared_ptr<chaiscript::AST_Node>_*,_std::vector<std::shared_ptr<chaiscript::AST_Node>,_std::allocator<std::shared_ptr<chaiscript::AST_Node>_>_>_>
    ::operator++(&local_1b0);
  }
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_190);
  return in_RDI;
}

Assistant:

std::string to_string(const std::string &t_prepend = "") const {
        std::ostringstream oss;

        oss << t_prepend << "(" << ast_node_type_to_string(this->identifier) << ") "
            << this->text << " : " << this->location.start.line << ", " << this->location.start.column << '\n';

        for (auto & elem : this->children) {
          oss << elem->to_string(t_prepend + "  ");
        }
        return oss.str();
      }